

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicBasic::Run(BasicBasic *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int h;
  vec3 *expected;
  uint storageBlockBinding;
  float data [12];
  string local_88;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar6 = 0x10;
  if (bVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(std430, binding = 1) buffer InputBuffer {\n  vec4 position[3];\n} g_input_buffer;\nvoid main() {\n  gl_Position = g_input_buffer.position[gl_VertexID];\n}"
               ,"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
               ,"");
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_68,&local_88);
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar6 = -1;
    if (bVar1) {
      local_48 = 0x40400000bf800000;
      uStack_40 = 0x3f80000000000000;
      local_68.field_2._M_allocated_capacity = 0xbf80000040400000;
      local_68.field_2._8_8_ = 0x3f80000000000000;
      local_68._M_dataplus._M_p = (pointer)0xbf800000bf800000;
      local_68._M_string_length = 0x3f80000000000000;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,&local_68,0x88e4);
      storageBlockBinding = 0;
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      bVar1 = true;
      do {
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glShaderStorageBlockBinding
                  (this_00,this->m_program,0,storageBlockBinding);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,storageBlockBinding,this->m_buffer);
        h = 1;
        expected = (vec3 *)0x0;
        glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,4,0,3,1,0);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,storageBlockBinding,0);
        iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
        iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        local_88._M_dataplus._M_p = (pointer)0x3f80000000000000;
        local_88._M_string_length._0_4_ = 0;
        bVar2 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,iVar4,
                           *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_88,h,expected);
        if (!bVar2) break;
        bVar1 = storageBlockBinding < 7;
        storageBlockBinding = storageBlockBinding + 1;
      } while (storageBlockBinding != 8);
      lVar6 = -(ulong)bVar1;
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 1) buffer InputBuffer {" NL "  vec4 position[3];" NL "} g_input_buffer;" NL
			   "void main() {" NL "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}";

		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		glUseProgram(m_program);

		for (GLuint i = 0; i < 8; ++i)
		{
			if (!RunIteration(i))
				return ERROR;
		}
		return NO_ERROR;
	}